

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v6::internal::
          parse_align<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  wchar_t *pwVar4;
  align_t align;
  
  pwVar4 = begin + 1;
  uVar3 = (ulong)(pwVar4 != end);
  do {
    cVar1 = (char)begin[uVar3];
    if (cVar1 < '>') {
      if (cVar1 == '<') {
        align = left;
LAB_001c9ab5:
        if ((int)uVar3 != 0) {
          if (*begin == L'{') {
            error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
          }
          pwVar4 = begin + 2;
          (((handler->
            super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            ).super_specs_setter<wchar_t>.specs_)->fill).data_[0] = *begin;
        }
        specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
        ::on_align(handler,align);
        return pwVar4;
      }
      if (cVar1 == '=') {
        align = numeric;
        goto LAB_001c9ab5;
      }
    }
    else {
      if (cVar1 == '>') {
        align = right;
        goto LAB_001c9ab5;
      }
      if (cVar1 == '^') {
        align = center;
        goto LAB_001c9ab5;
      }
    }
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}